

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O1

void k054539_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int iVar1;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  ulong local_68;
  
  if ((*(byte *)((long)param + 0xb08) & 1) == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  if (samples == 0) {
    return;
  }
  lVar8 = *(long *)((long)param + 0xb10);
  bVar3 = *(byte *)((long)param + 0x8d8);
  local_68 = 0;
LAB_0016515e:
  dVar21 = 0.0;
  if ((bVar3 & 2) == 0) {
    dVar21 = (double)(int)*(short *)(lVar8 + (ulong)*(ushort *)((long)param + 0xb18) * 2);
  }
  *(undefined2 *)(lVar8 + (ulong)*(ushort *)((long)param + 0xb18) * 2) = 0;
  lVar12 = 0;
  dVar22 = dVar21;
LAB_00165190:
  bVar4 = *(byte *)((long)param + 0xb05);
  if (((bVar4 >> ((uint)lVar12 & 0x1f) & 1) != 0) &&
     (*(char *)((long)param + lVar12 + 0xbc0) == '\0')) {
    lVar13 = lVar12 * 0x20;
    bVar9 = *(byte *)((long)param + lVar13 + 0x8dc);
    uVar10 = (uint)*(byte *)((long)param + lVar13 + 0x8dd) + (uint)bVar9;
    if (0xfe < uVar10) {
      uVar10 = 0xff;
    }
    bVar5 = *(byte *)((long)param + lVar13 + 0x8de);
    if ((byte)(bVar5 + 0x7f) < 0xf) {
      uVar15 = bVar5 - 0x81;
    }
    else {
      uVar15 = bVar5 - 0x11;
      if (0xe < (byte)(bVar5 - 0x11)) {
        uVar15 = 7;
      }
    }
    puVar14 = (uint *)((long)param + lVar12 * 0x10 + 0xb40);
    uVar16 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar13 + 0x8db),
                            *(undefined2 *)((long)param + lVar13 + 0x8d9));
    dVar23 = *(double *)((long)param + lVar12 * 8 + 0x880);
    dVar24 = *(double *)((long)param + (ulong)bVar9 * 8 + 8);
    dVar28 = *(double *)((long)param + (ulong)uVar15 * 8 + 0x808);
    dVar26 = *(double *)((long)param + (ulong)(0xe - uVar15) * 8 + 0x808);
    dVar27 = *(double *)((long)param + (ulong)uVar10 * 8 + 8) * dVar23 * 0.5;
    uVar6 = *(ushort *)((long)param + lVar13 + 0x8df);
    uVar7 = *(ushort *)((long)param + 0xb18);
    uVar10 = (uint)CONCAT12(*(undefined1 *)((long)param + lVar13 + 0x8e7),
                            *(undefined2 *)((long)param + lVar13 + 0x8e5));
    bVar9 = *(byte *)((long)param + lVar12 * 2 + 0xad9) & 0x20;
    uVar15 = -uVar16;
    if (bVar9 == 0) {
      uVar15 = uVar16;
    }
    uVar16 = (uint)(bVar9 >> 5);
    iVar17 = uVar16 * 0x20000 + -0x10000;
    uVar16 = -uVar16 | 1;
    bVar9 = (byte)(1 << ((byte)lVar12 & 0x1f));
    if (uVar10 == *puVar14) {
      uVar11 = puVar14[1];
      uVar20 = puVar14[2];
      uVar18 = puVar14[3];
      uVar19 = uVar11;
      switch(*(byte *)((long)param + lVar12 * 2 + 0xad9) >> 2 & 3) {
      case 0:
switchD_00165314_caseD_0:
        uVar19 = uVar11 + uVar15;
        if (0xffff < uVar19) {
          do {
            uVar18 = uVar20;
            uVar15 = uVar19;
            uVar10 = uVar10 + uVar16;
            uVar20 = (uint)(short)((ushort)*(byte *)(*(long *)((long)param + 0xb30) +
                                                    (ulong)(*(uint *)((long)param + 0xb3c) & uVar10)
                                                    ) << 8);
            if (uVar20 == 0xffff8000) goto LAB_001654d2;
            uVar19 = iVar17 + uVar15;
          } while (0xffff < iVar17 + uVar15);
LAB_001654ca:
          uVar19 = uVar15 + iVar17;
        }
        break;
      case 1:
switchD_00165314_caseD_1:
        uVar19 = uVar11 + uVar15;
        if (0xffff < uVar19) {
          do {
            uVar18 = uVar20;
            uVar15 = uVar19;
            iVar1 = uVar10 + uVar16 * 2;
            uVar10 = uVar10 + uVar16 * 2;
            uVar20 = (int)(short)((ushort)*(byte *)(*(long *)((long)param + 0xb30) +
                                                   (ulong)(iVar1 + 1U &
                                                          *(uint *)((long)param + 0xb3c))) << 8) |
                     (uint)*(byte *)(*(long *)((long)param + 0xb30) +
                                    (ulong)(*(uint *)((long)param + 0xb3c) & uVar10));
            if (uVar20 == 0xffff8000) goto LAB_001654d2;
            uVar19 = iVar17 + uVar15;
          } while (0xffff < iVar17 + uVar15);
          goto LAB_001654ca;
        }
        break;
      case 2:
switchD_00165314_caseD_2:
        uVar10 = ((uVar11 & 0x8000) >> 0xf) + uVar10 * 2;
        uVar19 = uVar11 * 2 & 0xffff;
        if ((uVar11 & 0x8000) == 0) {
          uVar19 = uVar11 * 2;
        }
        uVar19 = uVar19 + uVar15;
        if (0xffff < uVar19) {
          do {
            uVar18 = uVar20;
            uVar11 = uVar19;
            uVar10 = uVar10 + uVar16;
            bVar5 = *(byte *)(*(long *)((long)param + 0xb30) +
                             (ulong)(uVar10 >> 1 & *(uint *)((long)param + 0xb3c)));
            uVar15 = (uint)bVar5;
            if ((bVar5 == 0x88) &&
               (uVar15 = 0x88, (*(byte *)((long)param + lVar12 * 2 + 0xada) & 1) != 0)) {
              uVar10 = (uint)*(byte *)((long)param + lVar13 + 0x8e2) * 0x200 +
                       (uint)*(byte *)((long)param + lVar13 + 0x8e1) * 2 |
                       (uint)*(byte *)((long)param + lVar13 + 0x8e3) << 0x11;
              uVar15 = (uint)*(byte *)(*(long *)((long)param + 0xb30) +
                                      (ulong)(*(uint *)((long)param + 0xb3c) & uVar10 >> 1));
            }
            if ((char)uVar15 == -0x78) {
              uVar19 = uVar11 + iVar17;
              uVar20 = 0;
              if (-1 < *(char *)((long)param + 0xb08)) {
                *(byte *)((long)param + 0xb05) = bVar4 & ~bVar9;
              }
              goto LAB_001655e7;
            }
            uVar20 = uVar15 & 0xf;
            if ((uVar10 & 1) != 0) {
              uVar20 = uVar15 >> 4;
            }
            uVar20 = (int)k054539_update::dpcm[uVar20] + uVar18;
            if (0x7ffe < (int)uVar20) {
              uVar20 = 0x7fff;
            }
            if ((int)uVar20 < -0x7fff) {
              uVar20 = 0xffff8000;
            }
            uVar19 = uVar11 + iVar17;
          } while (0xffff < uVar11 + iVar17);
          uVar19 = uVar11 + iVar17;
        }
LAB_001655e7:
        uVar19 = (uVar10 & 1) << 0xf | (int)uVar19 >> 1;
        uVar10 = uVar10 >> 1;
      }
    }
    else {
      *puVar14 = uVar10;
      uVar18 = 0;
      uVar20 = 0;
      uVar11 = 0;
      uVar19 = 0;
      switch(*(byte *)((long)param + lVar12 * 2 + 0xad9) >> 2 & 3) {
      case 0:
        goto switchD_00165314_caseD_0;
      case 1:
        goto switchD_00165314_caseD_1;
      case 2:
        goto switchD_00165314_caseD_2;
      }
    }
    goto switchD_00165314_caseD_3;
  }
  goto LAB_00165689;
LAB_001654d2:
  uVar19 = uVar15 + iVar17;
  uVar20 = 0;
  if (-1 < *(char *)((long)param + 0xb08)) {
    *(byte *)((long)param + 0xb05) = bVar4 & ~bVar9;
    uVar20 = 0;
  }
switchD_00165314_caseD_3:
  dVar25 = dVar28 * dVar24 * dVar23;
  dVar28 = 1.8;
  if (dVar25 <= 1.8) {
    dVar28 = dVar25;
  }
  dVar23 = dVar24 * dVar26 * dVar23;
  dVar24 = 1.8;
  if (dVar23 <= 1.8) {
    dVar24 = dVar23;
  }
  dVar23 = 1.8;
  if (dVar27 <= 1.8) {
    dVar23 = dVar27;
  }
  dVar26 = (double)(int)uVar20;
  dVar21 = dVar21 + dVar28 * dVar26;
  psVar2 = (short *)(lVar8 + (ulong)((uint)(uVar6 >> 3) + (uint)uVar7 * 2 & 0x1fff) * 2);
  *psVar2 = *psVar2 + (short)(int)(dVar23 * dVar26);
  dVar22 = dVar22 + dVar24 * dVar26;
  *puVar14 = uVar10;
  puVar14[1] = uVar19;
  puVar14[3] = uVar18;
  puVar14[2] = uVar20;
  if (-1 < *(char *)((long)param + 0xb08)) {
    *(char *)((long)param + lVar13 + 0x8e5) = (char)uVar10;
    *(char *)((long)param + lVar13 + 0x8e6) = (char)(uVar10 >> 8);
    *(char *)((long)param + lVar13 + 0x8e7) = (char)(uVar10 >> 0x10);
  }
LAB_00165689:
  lVar12 = lVar12 + 1;
  if (lVar12 == 8) goto code_r0x00165696;
  goto LAB_00165190;
code_r0x00165696:
  *(ushort *)((long)param + 0xb18) = (short)*(undefined4 *)((long)param + 0xb18) + 1U & 0x1fff;
  (*outputs)[local_68] = (int)dVar21;
  outputs[1][local_68] = (int)dVar22;
  local_68 = local_68 + 1;
  if (local_68 == samples) {
    return;
  }
  goto LAB_0016515e;
}

Assistant:

static void k054539_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k054539_state *info = (k054539_state *)param;
#define VOL_CAP 1.80

	static const INT16 dpcm[16] = {
		0 * 0x100,     1 * 0x100,   4 * 0x100,   9 * 0x100,  16 * 0x100, 25 * 0x100, 36 * 0x100, 49 * 0x100,
		-64 * 0x100, -49 * 0x100, -36 * 0x100, -25 * 0x100, -16 * 0x100, -9 * 0x100, -4 * 0x100, -1 * 0x100
	};

	INT16 *rbase = (INT16 *)info->ram;
	UINT32 sample, ch;

	if(!(info->regs[0x22f] & 1))
	{
		memset(outputs[0], 0, samples*sizeof(*outputs[0]));
		memset(outputs[1], 0, samples*sizeof(*outputs[1]));
		return;
	}

	for(sample = 0; sample != samples; sample++) {
		double lval, rval;
		if(!(info->flags & K054539_DISABLE_REVERB))
			lval = rval = rbase[info->reverb_pos];
		else
			lval = rval = 0;
		rbase[info->reverb_pos] = 0;

		for(ch=0; ch<8; ch++)
			if(info->regs[0x22c] & (1<<ch) && ! info->Muted[ch]) {
				UINT8 *base1 = info->regs + 0x20*ch;
				UINT8 *base2 = info->regs + 0x200 + 0x2*ch;
				k054539_channel *chan = info->channels + ch;
				int delta, vol, bval, pan;
				double cur_gain, lvol, rvol, rbvol;
				UINT32 cur_pos;
				int rdelta, fdelta, pdelta;
				int cur_pfrac, cur_val, cur_pval;

				delta = base1[0x00] | (base1[0x01] << 8) | (base1[0x02] << 16);

				vol = base1[0x03];

				bval = vol + base1[0x04];
				if (bval > 255)
					bval = 255;

				pan = base1[0x05];
				// DJ Main: 81-87 right, 88 middle, 89-8f left
				if (pan >= 0x81 && pan <= 0x8f)
					pan -= 0x81;
				else if (pan >= 0x11 && pan <= 0x1f)
					pan -= 0x11;
				else
					pan = 0x18 - 0x11;

				cur_gain = info->gain[ch];

				lvol = info->voltab[vol] * info->pantab[pan] * cur_gain;
				if (lvol > VOL_CAP)
					lvol = VOL_CAP;

				rvol = info->voltab[vol] * info->pantab[0xe - pan] * cur_gain;
				if (rvol > VOL_CAP)
					rvol = VOL_CAP;

				rbvol= info->voltab[bval] * cur_gain / 2;
				if (rbvol > VOL_CAP)
					rbvol = VOL_CAP;

				rdelta = (base1[6] | (base1[7] << 8)) >> 3;
				rdelta = (rdelta + info->reverb_pos) & 0x3fff;

				cur_pos = base1[0x0c] | (base1[0x0d] << 8) | (base1[0x0e] << 16);

				if(base2[0] & 0x20) {
					delta = -delta;
					fdelta = +0x10000;
					pdelta = -1;
				} else {
					fdelta = -0x10000;
					pdelta = +1;
				}

				if(cur_pos != chan->pos) {
					chan->pos = cur_pos;
					cur_pfrac = 0;
					cur_val = 0;
					cur_pval = 0;
				} else {
					cur_pfrac = chan->pfrac;
					cur_val = chan->val;
					cur_pval = chan->pval;
				}

				switch(base2[0] & 0xc) {
				case 0x0: { // 8bit pcm
					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x4: { // 16bit pcm lsb first
					pdelta <<= 1;

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x8: { // 4bit dpcm
					cur_pos <<= 1;
					cur_pfrac <<= 1;
					if(cur_pfrac & 0x10000) {
						cur_pfrac &= 0xffff;
						cur_pos |= 1;
					}

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						if(cur_val == 0x88 && (base2[1] & 1)) {
							cur_pos = (base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16)) << 1;
							cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						}
						if(cur_val == 0x88) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
						if(cur_pos & 1)
							cur_val >>= 4;
						else
							cur_val &= 15;
						cur_val = cur_pval + dpcm[cur_val];
						if(cur_val < -32768)
							cur_val = -32768;
						else if(cur_val > 32767)
							cur_val = 32767;
					}

					cur_pfrac >>= 1;
					if(cur_pos & 1)
						cur_pfrac |= 0x8000;
					cur_pos >>= 1;
					break;
				}
				default:
					LOG(("Unknown sample type %x for channel %d\n", base2[0] & 0xc, ch));
					break;
				}
				lval += cur_val * lvol;
				rval += cur_val * rvol;
				rbase[(rdelta + info->reverb_pos) & 0x1fff] += (INT16)(cur_val*rbvol);

				chan->pos = cur_pos;
				chan->pfrac = cur_pfrac;
				chan->pval = cur_pval;
				chan->val = cur_val;

				if(k054539_regupdate(info)) {
					base1[0x0c] = cur_pos     & 0xff;
					base1[0x0d] = cur_pos>> 8 & 0xff;
					base1[0x0e] = cur_pos>>16 & 0xff;
				}
			}
		info->reverb_pos = (info->reverb_pos + 1) & 0x1fff;
		outputs[0][sample] = (DEV_SMPL)lval;
		outputs[1][sample] = (DEV_SMPL)rval;
	}
}